

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O1

void __thiscall
Assimp::Ogre::OgreXmlSerializer::ReadBoneAssignments(OgreXmlSerializer *this,VertexDataXml *dest)

{
  pointer *ppVVar1;
  _Rb_tree_header *p_Var2;
  _Rb_tree_color _Var3;
  iterator __position;
  pointer pVVar4;
  uint16_t uVar5;
  int iVar6;
  uint32_t uVar7;
  _Rb_tree_node_base *p_Var8;
  Logger *this_00;
  runtime_error *this_01;
  iterator __begin4;
  pointer pVVar9;
  pointer pVVar10;
  float fVar11;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> influencedVertices;
  VertexBoneAssignment ba;
  long *local_1f8;
  long local_1e8 [2];
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_1d8;
  undefined1 local_1a8 [16];
  undefined1 local_198 [96];
  ios_base local_138 [264];
  
  if (dest != (VertexDataXml *)0x0) {
    p_Var2 = &local_1d8._M_impl.super__Rb_tree_header;
    local_1d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1d8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1d8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_1d8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    NextNode_abi_cxx11_(this);
    iVar6 = std::__cxx11::string::compare((char *)&this->m_currentNodeName);
    p_Var8 = local_1d8._M_impl.super__Rb_tree_header._M_header._M_left;
    if (iVar6 == 0) {
      do {
        uVar7 = ReadAttribute<unsigned_int>(this,"vertexindex");
        local_1a8._0_4_ = uVar7;
        uVar5 = ReadAttribute<unsigned_short>(this,"boneindex");
        local_1a8._4_2_ = uVar5;
        local_1a8._8_4_ = ReadAttribute<float>(this,"weight");
        __position._M_current =
             (dest->super_IVertexData).boneAssignments.
             super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (dest->super_IVertexData).boneAssignments.
            super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<Assimp::Ogre::VertexBoneAssignment,std::allocator<Assimp::Ogre::VertexBoneAssignment>>
          ::_M_realloc_insert<Assimp::Ogre::VertexBoneAssignment_const&>
                    ((vector<Assimp::Ogre::VertexBoneAssignment,std::allocator<Assimp::Ogre::VertexBoneAssignment>>
                      *)&(dest->super_IVertexData).boneAssignments,__position,
                     (VertexBoneAssignment *)local_1a8);
        }
        else {
          (__position._M_current)->weight = (float)local_1a8._8_4_;
          (__position._M_current)->vertexIndex = local_1a8._0_4_;
          (__position._M_current)->boneIndex = local_1a8._4_2_;
          *(undefined2 *)&(__position._M_current)->field_0x6 = local_1a8._6_2_;
          ppVVar1 = &(dest->super_IVertexData).boneAssignments.
                     super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppVVar1 = *ppVVar1 + 1;
        }
        std::
        _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
        ::_M_insert_unique<unsigned_int_const&>
                  ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                    *)&local_1d8,(uint *)local_1a8);
        NextNode_abi_cxx11_(this);
        iVar6 = std::__cxx11::string::compare((char *)&this->m_currentNodeName);
        p_Var8 = local_1d8._M_impl.super__Rb_tree_header._M_header._M_left;
      } while (iVar6 == 0);
    }
    for (; (_Rb_tree_header *)p_Var8 != p_Var2;
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
      _Var3 = p_Var8[1]._M_color;
      pVVar4 = (dest->super_IVertexData).boneAssignments.
               super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      fVar11 = 0.0;
      pVVar9 = (dest->super_IVertexData).boneAssignments.
               super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (pVVar10 = pVVar9; pVVar10 != pVVar4; pVVar10 = pVVar10 + 1) {
        if (pVVar10->vertexIndex == _Var3) {
          fVar11 = fVar11 + pVVar10->weight;
        }
      }
      if (pVVar9 != pVVar4 && (fVar11 < 0.95 || 1.05 < fVar11)) {
        do {
          if (pVVar9->vertexIndex == _Var3) {
            pVVar9->weight = pVVar9->weight / fVar11;
          }
          pVVar9 = pVVar9 + 1;
        } while (pVVar9 != pVVar4);
      }
    }
    this_00 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[5]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               (char (*) [5])"  - ");
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8," bone assignments",0x11);
    std::__cxx11::stringbuf::str();
    Logger::debug(this_00,(char *)local_1f8);
    if (local_1f8 != local_1e8) {
      operator_delete(local_1f8,local_1e8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&local_1d8);
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_1a8._0_8_ = local_198;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"Cannot read bone assignments, vertex data is null.","");
  std::runtime_error::runtime_error(this_01,(string *)local_1a8);
  *(undefined ***)this_01 = &PTR__runtime_error_008e3168;
  __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void OgreXmlSerializer::ReadBoneAssignments(VertexDataXml *dest)
{
    if (!dest) {
        throw DeadlyImportError("Cannot read bone assignments, vertex data is null.");
    }

    static const char *anVertexIndex = "vertexindex";
    static const char *anBoneIndex   = "boneindex";
    static const char *anWeight      = "weight";

    std::set<uint32_t> influencedVertices;

    NextNode();
    while(m_currentNodeName == nnVertexBoneAssignment)
    {
        VertexBoneAssignment ba;
        ba.vertexIndex = ReadAttribute<uint32_t>(anVertexIndex);
        ba.boneIndex = ReadAttribute<uint16_t>(anBoneIndex);
        ba.weight = ReadAttribute<float>(anWeight);

        dest->boneAssignments.push_back(ba);
        influencedVertices.insert(ba.vertexIndex);

        NextNode();
    }

    /** Normalize bone weights.
        Some exporters won't care if the sum of all bone weights
        for a single vertex equals 1 or not, so validate here. */
    const float epsilon = 0.05f;
    for (const uint32_t vertexIndex : influencedVertices)
    {
        float sum = 0.0f;
        for (VertexBoneAssignmentList::const_iterator baIter=dest->boneAssignments.begin(), baEnd=dest->boneAssignments.end(); baIter != baEnd; ++baIter)
        {
            if (baIter->vertexIndex == vertexIndex)
                sum += baIter->weight;
        }
        if ((sum < (1.0f - epsilon)) || (sum > (1.0f + epsilon)))
        {
            for (auto &boneAssign : dest->boneAssignments)
            {
                if (boneAssign.vertexIndex == vertexIndex)
                    boneAssign.weight /= sum;
            }
        }
    }

    ASSIMP_LOG_DEBUG_F( "  - ", dest->boneAssignments.size(), " bone assignments");
}